

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-rst.c
# Opt level: O1

int run_test_tcp_rst(void)

{
  int iVar1;
  undefined8 uVar2;
  void *pvVar3;
  undefined8 *extraout_RDX;
  int iVar4;
  size_t *__size;
  uv_connect_t *puVar5;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in server_addr;
  size_t sStack_38;
  code *pcStack_30;
  void *local_28;
  void *local_20;
  
  iVar4 = (int)&local_28;
  qbuf.base = "QSH";
  qbuf.len = 3;
  pcStack_30 = (code *)0x1ce550;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&stack0xffffffffffffffe8);
  local_20 = (void *)(long)iVar1;
  local_28 = (void *)0x0;
  if (local_20 == (void *)0x0) {
    pcStack_30 = (code *)0x1ce573;
    uVar2 = uv_default_loop();
    pcStack_30 = (code *)0x1ce582;
    iVar1 = uv_tcp_init(uVar2,&tcp);
    local_20 = (void *)(long)iVar1;
    local_28 = (void *)0x0;
    if (local_20 != (void *)0x0) goto LAB_001ce6b9;
    pcStack_30 = (code *)0x1ce5bf;
    iVar1 = uv_tcp_connect(&connect_req,&tcp,&stack0xffffffffffffffe8,connect_cb);
    local_20 = (void *)(long)iVar1;
    local_28 = (void *)0x0;
    if (local_20 != (void *)0x0) goto LAB_001ce6c6;
    pcStack_30 = (code *)0x1ce5e2;
    uVar2 = uv_default_loop();
    pcStack_30 = (code *)0x1ce5ec;
    uv_run(uVar2,0);
    local_20 = (void *)0x1;
    local_28 = (void *)(long)called_alloc_cb;
    if (local_28 != (void *)0x1) goto LAB_001ce6d3;
    local_20 = (void *)0x1;
    local_28 = (void *)(long)called_connect_cb;
    if (local_28 != (void *)0x1) goto LAB_001ce6e0;
    local_20 = (void *)0x1;
    local_28 = (void *)(long)called_close_cb;
    if (local_28 != (void *)0x1) goto LAB_001ce6ed;
    pcStack_30 = (code *)0x1ce65a;
    uVar2 = uv_default_loop();
    pcStack_30 = (code *)0x1ce66e;
    uv_walk(uVar2,close_walk_cb,0);
    pcStack_30 = (code *)0x1ce678;
    uv_run(uVar2,0);
    local_20 = (void *)0x0;
    pcStack_30 = (code *)0x1ce686;
    uVar2 = uv_default_loop();
    pcStack_30 = (code *)0x1ce68e;
    iVar1 = uv_loop_close(uVar2);
    local_28 = (void *)(long)iVar1;
    if (local_20 == local_28) {
      pcStack_30 = (code *)0x1ce6a4;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_30 = (code *)0x1ce6b9;
    run_test_tcp_rst_cold_1();
LAB_001ce6b9:
    pcStack_30 = (code *)0x1ce6c6;
    run_test_tcp_rst_cold_2();
LAB_001ce6c6:
    pcStack_30 = (code *)0x1ce6d3;
    run_test_tcp_rst_cold_3();
LAB_001ce6d3:
    pcStack_30 = (code *)0x1ce6e0;
    run_test_tcp_rst_cold_4();
LAB_001ce6e0:
    pcStack_30 = (code *)0x1ce6ed;
    run_test_tcp_rst_cold_5();
LAB_001ce6ed:
    pcStack_30 = (code *)0x1ce6fa;
    run_test_tcp_rst_cold_6();
  }
  puVar5 = (uv_connect_t *)&stack0xffffffffffffffe0;
  pcStack_30 = connect_cb;
  run_test_tcp_rst_cold_7();
  pcStack_30 = (code *)(long)iVar4;
  sStack_38 = 0;
  if (pcStack_30 == (code *)0x0) {
    if (puVar5 != &connect_req) goto LAB_001ce7c3;
    iVar1 = uv_read_start(&tcp,alloc_cb,read_cb);
    pcStack_30 = (code *)(long)iVar1;
    sStack_38 = 0;
    if (pcStack_30 == (code *)0x0) {
      pcStack_30 = (code *)qbuf.len;
      iVar1 = uv_try_write(&tcp,&qbuf,1);
      sStack_38 = (size_t)iVar1;
      if (pcStack_30 == (code *)sStack_38) {
        called_connect_cb = called_connect_cb + 1;
        return (int)pcStack_30;
      }
      goto LAB_001ce7d7;
    }
  }
  else {
    connect_cb_cold_1();
LAB_001ce7c3:
    connect_cb_cold_2();
  }
  connect_cb_cold_3();
LAB_001ce7d7:
  __size = &sStack_38;
  connect_cb_cold_4();
  pvVar3 = malloc((size_t)__size);
  *extraout_RDX = pvVar3;
  extraout_RDX[1] = __size;
  called_alloc_cb = called_alloc_cb + 1;
  return (int)pvVar3;
}

Assistant:

TEST_IMPL(tcp_rst) {
#if defined(__OpenBSD__)
  RETURN_SKIP("Test does not currently work in OpenBSD");
#endif
#ifndef _WIN32
  struct sockaddr_in server_addr;
  int r;

  qbuf.base = "QSH";
  qbuf.len = 3;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &server_addr));
  r = uv_tcp_init(uv_default_loop(), &tcp);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &tcp,
                     (const struct sockaddr*) &server_addr,
                     connect_cb);
  ASSERT_OK(r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, called_alloc_cb);
  ASSERT_EQ(1, called_connect_cb);
  ASSERT_EQ(1, called_close_cb);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
#else
  RETURN_SKIP("Unix only test");
#endif
}